

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_packushb_mips64(uint64_t fs,uint64_t ft)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  
  lVar2 = 0;
  bVar3 = 0;
  uVar1 = 0;
  do {
    uVar4 = (uint)(short)(fs >> (bVar3 & 0x3f));
    if (0xfe < (int)uVar4) {
      uVar4 = 0xff;
    }
    uVar1 = uVar1 | (ulong)(uVar4 & 0xff) << ((byte)lVar2 & 0x3f);
    bVar3 = bVar3 + 0x10;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  bVar3 = 0x20;
  lVar2 = 0;
  do {
    uVar4 = (uint)(short)(ft >> ((byte)lVar2 & 0x3f));
    if (0xfe < (int)uVar4) {
      uVar4 = 0xff;
    }
    uVar1 = uVar1 | (ulong)(uVar4 & 0xff) << (bVar3 & 0x3f);
    lVar2 = lVar2 + 0x10;
    bVar3 = bVar3 + 8;
  } while (lVar2 != 0x40);
  return uVar1;
}

Assistant:

uint64_t helper_packushb(uint64_t fs, uint64_t ft)
{
    uint64_t fd = 0;
    unsigned int i;

    for (i = 0; i < 4; ++i) {
        int16_t tmp = fs >> (i * 16);
        tmp = SATUB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8);
    }
    for (i = 0; i < 4; ++i) {
        int16_t tmp = ft >> (i * 16);
        tmp = SATUB(tmp);
        fd |= (uint64_t)(tmp & 0xff) << (i * 8 + 32);
    }

    return fd;
}